

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O0

bool __thiscall
ruckig::Profile::
check_for_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
          (Profile *this,double jf,double aMax,double aMin)

{
  value_type_conflict2 vVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  reference pvVar9;
  reference pvVar10;
  array<double,_8UL> *paVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  bool local_171;
  double local_170;
  double local_168;
  double local_e8;
  double local_d8;
  double local_c8;
  double local_b8;
  double aLowLim;
  double aUppLim;
  size_t i_1;
  undefined8 local_68;
  double local_60;
  undefined8 local_58;
  double local_50;
  undefined8 local_48;
  double local_40;
  ulong local_38;
  size_t i;
  double aMin_local;
  double aMax_local;
  double jf_local;
  Profile *this_local;
  
  i = (size_t)aMin;
  aMin_local = aMax;
  aMax_local = jf;
  jf_local = (double)this;
  pvVar9 = std::array<double,_7UL>::operator[](&this->t,0);
  if (0.0 < *pvVar9 || *pvVar9 == 0.0) {
    pvVar9 = std::array<double,_7UL>::operator[](&this->t,0);
    vVar1 = *pvVar9;
    pvVar9 = std::array<double,_7UL>::operator[](&this->t_sum,0);
    *pvVar9 = vVar1;
    for (local_38 = 0; local_38 < 6; local_38 = local_38 + 1) {
      pvVar9 = std::array<double,_7UL>::operator[](&this->t,local_38 + 1);
      if (*pvVar9 <= 0.0 && *pvVar9 != 0.0) {
        return false;
      }
      pvVar9 = std::array<double,_7UL>::operator[](&this->t_sum,local_38);
      dVar2 = *pvVar9;
      pvVar9 = std::array<double,_7UL>::operator[](&this->t,local_38 + 1);
      dVar3 = *pvVar9;
      pvVar9 = std::array<double,_7UL>::operator[](&this->t_sum,local_38 + 1);
      *pvVar9 = dVar2 + dVar3;
    }
    pvVar9 = std::array<double,_7UL>::back(&this->t_sum);
    if (*pvVar9 <= 1000000000000.0) {
      pvVar9 = std::array<double,_7UL>::operator[](&this->t,0);
      if (*pvVar9 <= 0.0) {
        local_b8 = 0.0;
      }
      else {
        local_b8 = aMax_local;
      }
      i_1 = (size_t)local_b8;
      local_68 = 0;
      pvVar9 = std::array<double,_7UL>::operator[](&this->t,2);
      if (*pvVar9 <= 0.0) {
        local_c8 = 0.0;
      }
      else {
        local_c8 = -aMax_local;
      }
      local_60 = local_c8;
      local_58 = 0;
      pvVar9 = std::array<double,_7UL>::operator[](&this->t,4);
      if (*pvVar9 <= 0.0) {
        local_d8 = 0.0;
      }
      else {
        local_d8 = aMax_local;
      }
      local_50 = local_d8;
      local_48 = 0;
      pvVar9 = std::array<double,_7UL>::operator[](&this->t,6);
      if (*pvVar9 <= 0.0) {
        local_e8 = 0.0;
      }
      else {
        local_e8 = -aMax_local;
      }
      local_40 = local_e8;
      memcpy(&this->j,&i_1,0x38);
      for (aUppLim = 0.0; (ulong)aUppLim < 7; aUppLim = (double)((long)aUppLim + 1)) {
        pvVar10 = std::array<double,_8UL>::operator[](&this->a,(size_type)aUppLim);
        dVar2 = *pvVar10;
        pvVar9 = std::array<double,_7UL>::operator[](&this->t,(size_type)aUppLim);
        dVar3 = *pvVar9;
        pvVar9 = std::array<double,_7UL>::operator[](&this->j,(size_type)aUppLim);
        dVar4 = *pvVar9;
        pvVar10 = std::array<double,_8UL>::operator[](&this->a,(long)aUppLim + 1);
        *pvVar10 = dVar3 * dVar4 + dVar2;
        pvVar10 = std::array<double,_8UL>::operator[](&this->v,(size_type)aUppLim);
        dVar2 = *pvVar10;
        pvVar9 = std::array<double,_7UL>::operator[](&this->t,(size_type)aUppLim);
        dVar3 = *pvVar9;
        pvVar10 = std::array<double,_8UL>::operator[](&this->a,(size_type)aUppLim);
        dVar4 = *pvVar10;
        pvVar9 = std::array<double,_7UL>::operator[](&this->t,(size_type)aUppLim);
        dVar5 = *pvVar9;
        pvVar9 = std::array<double,_7UL>::operator[](&this->j,(size_type)aUppLim);
        dVar6 = *pvVar9;
        pvVar10 = std::array<double,_8UL>::operator[](&this->v,(long)aUppLim + 1);
        *pvVar10 = dVar3 * (dVar4 + (dVar5 * dVar6) / 2.0) + dVar2;
        pvVar10 = std::array<double,_8UL>::operator[](&this->p,(size_type)aUppLim);
        dVar2 = *pvVar10;
        pvVar9 = std::array<double,_7UL>::operator[](&this->t,(size_type)aUppLim);
        dVar3 = *pvVar9;
        pvVar10 = std::array<double,_8UL>::operator[](&this->v,(size_type)aUppLim);
        dVar4 = *pvVar10;
        pvVar9 = std::array<double,_7UL>::operator[](&this->t,(size_type)aUppLim);
        dVar5 = *pvVar9;
        pvVar10 = std::array<double,_8UL>::operator[](&this->a,(size_type)aUppLim);
        dVar6 = *pvVar10;
        pvVar9 = std::array<double,_7UL>::operator[](&this->t,(size_type)aUppLim);
        dVar7 = *pvVar9;
        pvVar9 = std::array<double,_7UL>::operator[](&this->j,(size_type)aUppLim);
        dVar8 = *pvVar9;
        pvVar10 = std::array<double,_8UL>::operator[](&this->p,(long)aUppLim + 1);
        *pvVar10 = dVar3 * (dVar5 * (dVar6 / 2.0 + (dVar7 * dVar8) / 6.0) + dVar4) + dVar2;
      }
      this->control_signs = UDUD;
      this->limits = NONE;
      this->direction = (uint)(aMin_local <= 0.0);
      if (this->direction == UP) {
        local_168 = aMin_local;
      }
      else {
        local_168 = (double)i;
      }
      local_168 = local_168 + 1e-12;
      if (this->direction == UP) {
        local_170 = (double)i;
      }
      else {
        local_170 = aMin_local;
      }
      local_170 = local_170 - 1e-12;
      paVar11 = &this->v;
      std::array<double,_8UL>::back(paVar11);
      std::abs((int)paVar11);
      local_171 = false;
      if (extraout_XMM0_Qa < 1e-08) {
        paVar11 = &this->a;
        std::array<double,_8UL>::back(paVar11);
        std::abs((int)paVar11);
        local_171 = false;
        if (extraout_XMM0_Qa_00 < 1e-10) {
          pvVar10 = std::array<double,_8UL>::operator[](&this->a,1);
          local_171 = false;
          if (local_170 <= *pvVar10) {
            pvVar10 = std::array<double,_8UL>::operator[](&this->a,3);
            local_171 = false;
            if (local_170 <= *pvVar10) {
              pvVar10 = std::array<double,_8UL>::operator[](&this->a,5);
              local_171 = false;
              if (local_170 <= *pvVar10) {
                pvVar10 = std::array<double,_8UL>::operator[](&this->a,1);
                local_171 = false;
                if (*pvVar10 <= local_168) {
                  pvVar10 = std::array<double,_8UL>::operator[](&this->a,3);
                  local_171 = false;
                  if (*pvVar10 <= local_168) {
                    pvVar10 = std::array<double,_8UL>::operator[](&this->a,5);
                    local_171 = *pvVar10 <= local_168;
                  }
                }
              }
            }
          }
        }
      }
      this_local._7_1_ = local_171;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool check_for_velocity(double jf, double aMax, double aMin) {
        if (t[0] < 0) {
            return false;
        }

        t_sum[0] = t[0];
        for (size_t i = 0; i < 6; ++i) {
            if (t[i+1] < 0) {
                return false;
            }

            t_sum[i+1] = t_sum[i] + t[i+1];
        }

        if constexpr (limits == ReachedLimits::ACC0) {
            if (t[1] < std::numeric_limits<double>::epsilon()) {
                return false;
            }
        }

        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        if constexpr (control_signs == ControlSigns::UDDU) {
            j = {(t[0] > 0 ? jf : 0), 0, (t[2] > 0 ? -jf : 0), 0, (t[4] > 0 ? -jf : 0), 0, (t[6] > 0 ? jf : 0)};
        } else {
            j = {(t[0] > 0 ? jf : 0), 0, (t[2] > 0 ? -jf : 0), 0, (t[4] > 0 ? jf : 0), 0, (t[6] > 0 ? -jf : 0)};
        }

        for (size_t i = 0; i < 7; ++i) {
            a[i+1] = a[i] + t[i] * j[i];
            v[i+1] = v[i] + t[i] * (a[i] + t[i] * j[i] / 2);
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * (a[i] / 2 + t[i] * j[i] / 6));
        }

        this->control_signs = control_signs;
        this->limits = limits;

        direction = (aMax > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;
        const double aUppLim = (direction == Profile::Direction::UP ? aMax : aMin) + a_eps;
        const double aLowLim = (direction == Profile::Direction::UP ? aMin : aMax) - a_eps;

        // Velocity limit can be broken in the beginning if both initial velocity and acceleration are too high
        // std::cout << std::setprecision(15) << "target: " << std::abs(p.back() - pf) << " " << std::abs(v.back() - vf) << " " << std::abs(a.back() - af) << " T: " << t_sum.back() << " " << to_string() << std::endl;
        return std::abs(v.back() - vf) < v_precision && std::abs(a.back() - af) < a_precision
            && a[1] >= aLowLim && a[3] >= aLowLim && a[5] >= aLowLim
            && a[1] <= aUppLim && a[3] <= aUppLim && a[5] <= aUppLim;
    }